

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O2

KeyCode anon_unknown.dwarf_19d22f::keyToKeyCode(Key key)

{
  KeyCode KVar1;
  KeySym KVar2;
  Display *display;
  
  KVar2 = sf::priv::keyToKeySym(key);
  if (KVar2 != 0) {
    display = sf::priv::OpenDisplay();
    KVar1 = XKeysymToKeycode(display,KVar2);
    sf::priv::CloseDisplay(display);
    if (KVar1 != '\0') {
      return KVar1;
    }
  }
  KVar1 = DAT_001cbbb5;
  if (key != RAlt) {
    KVar1 = '\0';
  }
  return KVar1;
}

Assistant:

KeyCode keyToKeyCode(sf::Keyboard::Key key)
{
    KeySym keysym = sf::priv::keyToKeySym(key);

    if (keysym != NoSymbol)
    {
        Display* display = sf::priv::OpenDisplay();
        KeyCode keycode = XKeysymToKeycode(display, keysym);
        sf::priv::CloseDisplay(display);

        if (keycode != NullKeyCode)
            return keycode;
    }

    // Fallback for when XKeysymToKeycode cannot tell the KeyCode for XK_Alt_R
    if (key == sf::Keyboard::RAlt)
        return scancodeToKeycode[sf::Keyboard::Scan::RAlt];

    return NullKeyCode;
}